

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void noir_replace(uint8_t *pal_start,uint8_t *pal_end)

{
  uint8_t *pal_end_local;
  uint8_t *pal_start_local;
  
  for (pal_end_local = pal_start; pal_end_local < pal_end; pal_end_local = pal_end_local + 1) {
    if (*pal_end_local < 0x40) {
      *pal_end_local = ""[*pal_end_local];
    }
  }
  return;
}

Assistant:

static inline void noir_replace(uint8_t *pal_start, uint8_t *pal_end) {
    static const uint8_t noir_lookup[] = {
        0x00, 0x2d, 0x2d, 0x2d, 0x2d, 0x2d, 0x2d, 0x2d,
        0x2d, 0x2d, 0x2d, 0x2d, 0x2d, 0x0f, 0x0f, 0x0f,
        0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x1d, 0x0f, 0x0f,
        0x20, 0x3d, 0x3d, 0x3d, 0x3d, 0x3d, 0x3d, 0x3d,
        0x3d, 0x3d, 0x3d, 0x3d, 0x3d, 0x2d, 0x0f, 0x0f,
        0x30, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10, 0x10,
        0x10, 0x10, 0x10, 0x10, 0x10, 0x3d, 0x0f, 0x0f,
    };
    for(; pal_start < pal_end; pal_start++) {
        if ((*pal_start <= 0x3f)) {
            *pal_start = noir_lookup[*pal_start];
        }
    }
}